

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O2

IMove __thiscall
generic_bots::
FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
::MakeMove(FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
           *this)

{
  IMove IVar1;
  MCTSResults *result;
  double dVar2;
  double dVar3;
  IMove move;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> results;
  IMove local_30;
  _Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> local_28;
  
  (*this->mcts)((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)&local_28,
                (this->super_IBot<uttt::IBoard>).game,this->num_iterations);
  local_30 = -1;
  dVar2 = -1.1;
  for (; local_28._M_impl.super__Vector_impl_data._M_start !=
         local_28._M_impl.super__Vector_impl_data._M_finish;
      local_28._M_impl.super__Vector_impl_data._M_start =
           local_28._M_impl.super__Vector_impl_data._M_start + 1) {
    dVar3 = (local_28._M_impl.super__Vector_impl_data._M_start)->value /
            (double)(local_28._M_impl.super__Vector_impl_data._M_start)->total;
    if (dVar2 < dVar3) {
      local_30 = (local_28._M_impl.super__Vector_impl_data._M_start)->move;
      dVar2 = dVar3;
    }
  }
  uttt::IBoard::ApplyMove((this->super_IBot<uttt::IBoard>).game,&local_30);
  IVar1 = local_30;
  std::_Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::~_Vector_base(&local_28)
  ;
  return IVar1;
}

Assistant:

game::IMove
FixedMctsBot<IGame, MCTS>::MakeMove()
{
    auto results = mcts(*this->game, num_iterations);

    double max = -1.1;
    game::IMove move = -1;
    for (const auto &result : results)
    {
        auto v = result.value / result.total;
        if (v > max)
            max = v, move = result.move;
    }

    this->game->ApplyMove(move);

    return move;
}